

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<ot::commissioner::State_()>::PerformDefaultAction
          (FunctionMocker<ot::commissioner::State_()> *this,ArgumentTuple *args,
          string *call_description)

{
  Result RVar1;
  State SVar2;
  OnCallSpec<ot::commissioner::State_()> *this_00;
  Action<ot::commissioner::State_()> *pAVar3;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<ot::commissioner::State_()> *)0x0) {
    pAVar3 = OnCallSpec<ot::commissioner::State_()>::GetAction(this_00);
    RVar1 = Action<ot::commissioner::State_()>::Perform(pAVar3);
    return RVar1;
  }
  std::operator+(&bStack_28,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  SVar2 = DefaultValue<ot::commissioner::State>::Get();
  std::__cxx11::string::~string((string *)&bStack_28);
  return SVar2;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }